

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

Vec_Ptr_t * Abc_NodeFindCone_rec(Abc_Obj_t *pNode)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *vSuper;
  void **ppvVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  long lVar8;
  ulong uVar9;
  Abc_Obj_t *pNodeE;
  Abc_Obj_t *pNodeT;
  Abc_Obj_t *local_28;
  Abc_Obj_t *local_20;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x1ca,"Vec_Ptr_t *Abc_NodeFindCone_rec(Abc_Obj_t *)");
  }
  uVar3 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar3 == 2) {
    return (Vec_Ptr_t *)0x0;
  }
  if (uVar3 == 5) {
    return (Vec_Ptr_t *)0x0;
  }
  vSuper = (Vec_Ptr_t *)malloc(0x10);
  vSuper->nCap = 8;
  vSuper->nSize = 0;
  ppvVar5 = (void **)malloc(0x40);
  vSuper->pArray = ppvVar5;
  iVar4 = Abc_NodeIsMuxType(pNode);
  if (iVar4 == 0) {
    iVar4 = Abc_NodeBalanceCone_rec(pNode,vSuper,1,1,0);
    if (vSuper->nSize < 2) {
      __assert_fail("vNodes->nSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0x1db,"Vec_Ptr_t *Abc_NodeFindCone_rec(Abc_Obj_t *)");
    }
    if (0 < vSuper->nSize) {
      lVar8 = 0;
      do {
        puVar1 = (uint *)(((ulong)vSuper->pArray[lVar8] & 0xfffffffffffffffe) + 0x14);
        *puVar1 = *puVar1 & 0xffffffdf;
        lVar8 = lVar8 + 1;
      } while (lVar8 < vSuper->nSize);
    }
    if (iVar4 == -1) {
      vSuper->nSize = 0;
    }
    goto LAB_00295993;
  }
  pAVar6 = Abc_NodeRecognizeMux(pNode,&local_20,&local_28);
  uVar3 = vSuper->nCap;
  if (vSuper->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vSuper->pArray,0x80);
      }
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar3 * 2;
      if (iVar4 <= (int)uVar3) goto LAB_00295854;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vSuper->pArray,(ulong)uVar3 << 4);
      }
    }
    vSuper->pArray = ppvVar5;
    vSuper->nCap = iVar4;
  }
LAB_00295854:
  iVar4 = vSuper->nSize;
  uVar3 = iVar4 + 1;
  vSuper->nSize = uVar3;
  vSuper->pArray[iVar4] = (void *)((ulong)pAVar6 & 0xfffffffffffffffe);
  if (-1 < (long)iVar4) {
    uVar9 = 0;
    do {
      if (vSuper->pArray[uVar9] == (void *)((ulong)local_20 & 0xfffffffffffffffe))
      goto LAB_002958fc;
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  uVar2 = vSuper->nCap;
  if (uVar3 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vSuper->pArray,0x80);
      }
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar2 * 2;
      if (iVar4 <= (int)uVar2) goto LAB_002958ea;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
    }
    vSuper->pArray = ppvVar5;
    vSuper->nCap = iVar4;
  }
LAB_002958ea:
  iVar4 = vSuper->nSize;
  vSuper->nSize = iVar4 + 1;
  vSuper->pArray[iVar4] = (void *)((ulong)local_20 & 0xfffffffffffffffe);
LAB_002958fc:
  uVar3 = vSuper->nSize;
  if (0 < (long)(int)uVar3) {
    lVar8 = 0;
    do {
      if (vSuper->pArray[lVar8] == (void *)((ulong)local_28 & 0xfffffffffffffffe))
      goto LAB_00295993;
      lVar8 = lVar8 + 1;
    } while ((int)uVar3 != lVar8);
  }
  uVar2 = vSuper->nCap;
  if (uVar3 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vSuper->pArray,0x80);
      }
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar2 * 2;
      if (iVar4 <= (int)uVar2) goto LAB_00295981;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
    }
    vSuper->pArray = ppvVar5;
    vSuper->nCap = iVar4;
  }
LAB_00295981:
  iVar4 = vSuper->nSize;
  vSuper->nSize = iVar4 + 1;
  vSuper->pArray[iVar4] = (void *)((ulong)local_28 & 0xfffffffffffffffe);
LAB_00295993:
  if (0 < vSuper->nSize) {
    lVar8 = 0;
    do {
      pAVar6 = (Abc_Obj_t *)((ulong)vSuper->pArray[lVar8] & 0xfffffffffffffffe);
      if ((pAVar6->field_6).pTemp == (void *)0x0) {
        pAVar7 = (Abc_Obj_t *)Abc_NodeFindCone_rec(pAVar6);
        (pAVar6->field_6).pCopy = pAVar7;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vSuper->nSize);
  }
  return vSuper;
}

Assistant:

Vec_Ptr_t * Abc_NodeFindCone_rec( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNodeC, * pNodeT, * pNodeE;
    int RetValue, i;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( Abc_ObjIsCi(pNode) )
        return NULL;
    // start the new array
    vNodes = Vec_PtrAlloc( 4 );
    // if the node is the MUX collect its fanins
    if ( Abc_NodeIsMuxType(pNode) )
    {
        pNodeC = Abc_NodeRecognizeMux( pNode, &pNodeT, &pNodeE );
        Vec_PtrPush( vNodes, Abc_ObjRegular(pNodeC) );
        Vec_PtrPushUnique( vNodes, Abc_ObjRegular(pNodeT) );
        Vec_PtrPushUnique( vNodes, Abc_ObjRegular(pNodeE) );
    }
    else
    {
        // collect the nodes in the implication supergate
        RetValue = Abc_NodeBalanceCone_rec( pNode, vNodes, 1, 1, 0 );
        assert( vNodes->nSize > 1 );
        // unmark the visited nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            Abc_ObjRegular(pNode)->fMarkB = 0;
        // if we found the node and its complement in the same implication supergate, 
        // return empty set of nodes (meaning that we should use constant-0 node)
        if ( RetValue == -1 )
            vNodes->nSize = 0;
    }
    // call for the fanin
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNode = Abc_ObjRegular(pNode);
        if ( pNode->pCopy )
            continue;
        pNode->pCopy = (Abc_Obj_t *)Abc_NodeFindCone_rec( pNode );
    }
    return vNodes;
}